

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void sort_rooms(level *lev,int levstyle)

{
  void *__dest;
  void *__dest_00;
  void *__base;
  schar *psVar1;
  char cVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  code *__compar;
  mkroom *__dest_01;
  size_t __nmemb;
  long lVar6;
  int iVar7;
  
  if (0 < lev->nroom) {
    __compar = sort_rooms_standard_comp;
    switch(levstyle) {
    case 0:
    case 1:
    case 3:
      break;
    case 2:
      __compar = sort_rooms_ring_comp;
      break;
    case 4:
      goto switchD_001d5b42_caseD_4;
    default:
      warning("sort_rooms: unknown levstyle %d");
    }
    __dest = xmalloc(lev->nroom * 0xd8);
    memcpy(__dest,lev->rooms,(long)lev->nroom * 0xd8);
    if (lev->doorindex < 1) {
      __dest_00 = (void *)0x0;
    }
    else {
      __dest_00 = xmalloc(lev->doorindex * 2);
      memcpy(__dest_00,lev->doors,(long)lev->doorindex * 2);
    }
    __base = xmalloc(lev->nroom * 0x14);
    __nmemb = (size_t)lev->nroom;
    if (0 < (long)__nmemb) {
      psVar1 = &lev->rooms[0].hy;
      piVar3 = (int *)((long)__base + 0x10);
      sVar4 = 0;
      do {
        piVar3[-4] = (int)sVar4;
        piVar3[-3] = (int)((mkroom *)(psVar1 + -3))->lx;
        piVar3[-2] = (int)psVar1[-1];
        piVar3[-1] = (int)psVar1[-2];
        *piVar3 = (int)*psVar1;
        sVar4 = sVar4 + 1;
        psVar1 = psVar1 + 0xd8;
        piVar3 = piVar3 + 5;
      } while (__nmemb != sVar4);
    }
    qsort(__base,__nmemb,0x14,__compar);
    if (0 < lev->nroom) {
      lVar6 = 0;
      iVar7 = 0;
      do {
        __dest_01 = lev->rooms + lVar6;
        memcpy(__dest_01,(void *)((long)*(int *)((long)__base + lVar6 * 0x14) * 0xd8 + (long)__dest)
               ,0xd8);
        if (__dest_00 != (void *)0x0) {
          cVar2 = __dest_01->doorct;
          if ('\0' < cVar2) {
            lVar5 = 0;
            do {
              lev->doors[iVar7 + lVar5] =
                   *(coord *)((long)__dest_00 + (__dest_01->fdoor + lVar5) * 2);
              lVar5 = lVar5 + 1;
              cVar2 = __dest_01->doorct;
            } while (lVar5 < cVar2);
          }
          __dest_01->fdoor = (schar)iVar7;
          iVar7 = iVar7 + cVar2;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < lev->nroom);
    }
  }
switchD_001d5b42_caseD_4:
  return;
}

Assistant:

void sort_rooms(struct level *lev, int levstyle)
{
	struct mkroom *tmprooms;
	coord *tmpdoors;
	struct sort_rooms_data *sortable;
	int (*sort_func)(const void *, const void *);
	int i, j, new_door_index;

	if (lev->nroom < 1) return;

	/* required for corridors of some level styles */
	switch (levstyle) {
	default:
	    warning("sort_rooms: unknown levstyle %d", levstyle);
	    /* fall through */
	case LEVSTYLE_STANDARD:
	case LEVSTYLE_ANYTOANY:
	case LEVSTYLE_HUB:
	    sort_func = sort_rooms_standard_comp;
	    break;
	case LEVSTYLE_RING:
	    sort_func = sort_rooms_ring_comp;
	    break;
	case LEVSTYLE_GRID:
	    /* no sorting */
	    return;
	}

	/* save rooms and doors in their original order */
	tmprooms = xmalloc(lev->nroom * sizeof(struct mkroom));
	memcpy(tmprooms, lev->rooms, lev->nroom * sizeof(struct mkroom));
	if (lev->doorindex > 0) {
		tmpdoors = xmalloc(lev->doorindex * sizeof(coord));
		memcpy(tmpdoors, lev->doors, lev->doorindex * sizeof(coord));
	} else {
		tmpdoors = NULL;
	}

	/* sort rooms from left to right */
	sortable = xmalloc(lev->nroom * sizeof(struct sort_rooms_data));
	for (i = 0; i < lev->nroom; i++) {
		sortable[i].room_index = i;
		sortable[i].lx = lev->rooms[i].lx;
		sortable[i].ly = lev->rooms[i].ly;
		sortable[i].hx = lev->rooms[i].hx;
		sortable[i].hy = lev->rooms[i].hy;
	}
	qsort(sortable, lev->nroom, sizeof(struct sort_rooms_data), sort_func);

	/* apply room sorting */
	new_door_index = 0;
	for (i = 0; i < lev->nroom; i++) {
		struct mkroom *room;
		lev->rooms[i] = tmprooms[sortable[i].room_index];
		room = &lev->rooms[i];

		/* reorder doors to match sorted room order */
		if (!tmpdoors) continue;
		for (j = 0; j < room->doorct; j++)
			lev->doors[new_door_index + j] = tmpdoors[room->fdoor + j];
		room->fdoor = new_door_index;
		new_door_index += room->doorct;
	}
}